

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall higan::HttpServer::OnNewConnection(HttpServer *this,TcpConnectionPtr *connection)

{
  element_type *peVar1;
  HttpServer *local_140;
  code *local_138;
  undefined8 local_130;
  type local_128;
  TcpConnectionCallback local_110;
  HttpContext local_f0;
  any local_60 [2];
  allocator<char> local_39;
  string local_38;
  __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  TcpConnectionPtr *connection_local;
  HttpServer *this_local;
  
  local_18 = (__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             connection;
  connection_local = (TcpConnectionPtr *)this;
  peVar1 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)connection);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HttpContext",&local_39);
  HttpContext::HttpContext(&local_f0);
  std::any::
  any<higan::HttpContext,higan::HttpContext,std::any::_Manager_external<higan::HttpContext>,void>
            (local_60,&local_f0);
  TcpConnection::SetContext(peVar1,&local_38,local_60);
  std::any::~any(local_60);
  HttpContext::~HttpContext(&local_f0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  peVar1 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  local_138 = OnMessageSendOver;
  local_130 = 0;
  local_140 = this;
  std::
  bind<void(higan::HttpServer::*)(std::shared_ptr<higan::TcpConnection>const&),higan::HttpServer*,std::_Placeholder<1>const&>
            (&local_128,(offset_in_HttpServer_to_subr *)&local_138,&local_140,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(std::shared_ptr<higan::TcpConnection>const&)>::
  function<std::_Bind<void(higan::HttpServer::*(higan::HttpServer*,std::_Placeholder<1>))(std::shared_ptr<higan::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<higan::TcpConnection>const&)> *)&local_110,&local_128);
  TcpConnection::SetWriteOverCallback(peVar1,&local_110);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::~function(&local_110);
  return;
}

Assistant:

void HttpServer::OnNewConnection(const TcpConnectionPtr& connection)
{
	connection->SetContext("HttpContext", HttpContext());
	connection->SetWriteOverCallback(std::bind(&HttpServer::OnMessageSendOver, this, _1));
}